

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImDrawList::UpdateClipRect(ImDrawList *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [11];
  undefined1 auVar10 [11];
  undefined1 auVar11 [12];
  undefined1 auVar12 [12];
  undefined1 auVar13 [13];
  undefined1 auVar14 [13];
  undefined1 auVar15 [14];
  undefined1 auVar16 [14];
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  byte bVar32;
  ImTextureID local_60;
  ImDrawCmd *local_50;
  ImDrawCmd *local_48;
  ImVec4 *local_40;
  ImDrawCmd *prev_cmd;
  ImDrawCmd *curr_cmd;
  ImVec4 curr_clip_rect;
  ImDrawList *this_local;
  
  if ((this->_ClipRectStack).Size == 0) {
    local_40 = &this->_Data->ClipRectFullscreen;
  }
  else {
    local_40 = (this->_ClipRectStack).Data + ((this->_ClipRectStack).Size + -1);
  }
  uVar1 = local_40->x;
  uVar3 = local_40->y;
  uVar2 = local_40->z;
  uVar4 = local_40->w;
  if ((this->CmdBuffer).Size < 1) {
    local_48 = (ImDrawCmd *)0x0;
  }
  else {
    local_48 = (this->CmdBuffer).Data + ((this->CmdBuffer).Size + -1);
  }
  if (local_48 != (ImDrawCmd *)0x0) {
    curr_cmd._0_1_ = (char)uVar1;
    curr_cmd._1_1_ = (char)((uint)uVar1 >> 8);
    curr_cmd._2_1_ = (char)((uint)uVar1 >> 0x10);
    curr_cmd._3_1_ = (char)((uint)uVar1 >> 0x18);
    curr_cmd._4_1_ = (char)uVar3;
    curr_cmd._5_1_ = (char)((uint)uVar3 >> 8);
    curr_cmd._6_1_ = (char)((uint)uVar3 >> 0x10);
    curr_cmd._7_1_ = (char)((uint)uVar3 >> 0x18);
    curr_clip_rect.x._0_1_ = (char)uVar2;
    curr_clip_rect.x._1_1_ = (char)((uint)uVar2 >> 8);
    curr_clip_rect.x._2_1_ = (char)((uint)uVar2 >> 0x10);
    curr_clip_rect.x._3_1_ = (char)((uint)uVar2 >> 0x18);
    curr_clip_rect.y._0_1_ = (char)uVar4;
    curr_clip_rect.y._1_1_ = (char)((uint)uVar4 >> 8);
    curr_clip_rect.y._2_1_ = (char)((uint)uVar4 >> 0x10);
    curr_clip_rect.y._3_1_ = (char)((uint)uVar4 >> 0x18);
    if (local_48->ElemCount != 0) {
      cVar17 = -(*(char *)&(local_48->ClipRect).x == (char)curr_cmd);
      cVar18 = -(*(char *)((long)&(local_48->ClipRect).x + 1) == curr_cmd._1_1_);
      cVar19 = -(*(char *)((long)&(local_48->ClipRect).x + 2) == curr_cmd._2_1_);
      cVar20 = -(*(char *)((long)&(local_48->ClipRect).x + 3) == curr_cmd._3_1_);
      cVar21 = -(*(char *)&(local_48->ClipRect).y == curr_cmd._4_1_);
      cVar22 = -(*(char *)((long)&(local_48->ClipRect).y + 1) == curr_cmd._5_1_);
      cVar23 = -(*(char *)((long)&(local_48->ClipRect).y + 2) == curr_cmd._6_1_);
      cVar24 = -(*(char *)((long)&(local_48->ClipRect).y + 3) == curr_cmd._7_1_);
      cVar25 = -(*(char *)&(local_48->ClipRect).z == curr_clip_rect.x._0_1_);
      cVar26 = -(*(char *)((long)&(local_48->ClipRect).z + 1) == curr_clip_rect.x._1_1_);
      cVar27 = -(*(char *)((long)&(local_48->ClipRect).z + 2) == curr_clip_rect.x._2_1_);
      cVar28 = -(*(char *)((long)&(local_48->ClipRect).z + 3) == curr_clip_rect.x._3_1_);
      cVar29 = -(*(char *)&(local_48->ClipRect).w == curr_clip_rect.y._0_1_);
      cVar30 = -(*(char *)((long)&(local_48->ClipRect).w + 1) == curr_clip_rect.y._1_1_);
      cVar31 = -(*(char *)((long)&(local_48->ClipRect).w + 2) == curr_clip_rect.y._2_1_);
      bVar32 = -(*(char *)((long)&(local_48->ClipRect).w + 3) == curr_clip_rect.y._3_1_);
      auVar5[1] = cVar18;
      auVar5[0] = cVar17;
      auVar5[2] = cVar19;
      auVar5[3] = cVar20;
      auVar5[4] = cVar21;
      auVar5[5] = cVar22;
      auVar5[6] = cVar23;
      auVar5[7] = cVar24;
      auVar5[8] = cVar25;
      auVar5[9] = cVar26;
      auVar5[10] = cVar27;
      auVar5[0xb] = cVar28;
      auVar5[0xc] = cVar29;
      auVar5[0xd] = cVar30;
      auVar5[0xe] = cVar31;
      auVar5[0xf] = bVar32;
      auVar6[1] = cVar18;
      auVar6[0] = cVar17;
      auVar6[2] = cVar19;
      auVar6[3] = cVar20;
      auVar6[4] = cVar21;
      auVar6[5] = cVar22;
      auVar6[6] = cVar23;
      auVar6[7] = cVar24;
      auVar6[8] = cVar25;
      auVar6[9] = cVar26;
      auVar6[10] = cVar27;
      auVar6[0xb] = cVar28;
      auVar6[0xc] = cVar29;
      auVar6[0xd] = cVar30;
      auVar6[0xe] = cVar31;
      auVar6[0xf] = bVar32;
      auVar15[1] = cVar20;
      auVar15[0] = cVar19;
      auVar15[2] = cVar21;
      auVar15[3] = cVar22;
      auVar15[4] = cVar23;
      auVar15[5] = cVar24;
      auVar15[6] = cVar25;
      auVar15[7] = cVar26;
      auVar15[8] = cVar27;
      auVar15[9] = cVar28;
      auVar15[10] = cVar29;
      auVar15[0xb] = cVar30;
      auVar15[0xc] = cVar31;
      auVar15[0xd] = bVar32;
      auVar13[1] = cVar21;
      auVar13[0] = cVar20;
      auVar13[2] = cVar22;
      auVar13[3] = cVar23;
      auVar13[4] = cVar24;
      auVar13[5] = cVar25;
      auVar13[6] = cVar26;
      auVar13[7] = cVar27;
      auVar13[8] = cVar28;
      auVar13[9] = cVar29;
      auVar13[10] = cVar30;
      auVar13[0xb] = cVar31;
      auVar13[0xc] = bVar32;
      auVar11[1] = cVar22;
      auVar11[0] = cVar21;
      auVar11[2] = cVar23;
      auVar11[3] = cVar24;
      auVar11[4] = cVar25;
      auVar11[5] = cVar26;
      auVar11[6] = cVar27;
      auVar11[7] = cVar28;
      auVar11[8] = cVar29;
      auVar11[9] = cVar30;
      auVar11[10] = cVar31;
      auVar11[0xb] = bVar32;
      auVar9[1] = cVar23;
      auVar9[0] = cVar22;
      auVar9[2] = cVar24;
      auVar9[3] = cVar25;
      auVar9[4] = cVar26;
      auVar9[5] = cVar27;
      auVar9[6] = cVar28;
      auVar9[7] = cVar29;
      auVar9[8] = cVar30;
      auVar9[9] = cVar31;
      auVar9[10] = bVar32;
      if ((ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) | (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB141(auVar15 >> 7,0) & 1) << 2 |
                   (ushort)(SUB131(auVar13 >> 7,0) & 1) << 3 |
                   (ushort)(SUB121(auVar11 >> 7,0) & 1) << 4 |
                   (ushort)(SUB111(auVar9 >> 7,0) & 1) << 5 |
                   (ushort)((byte)(CONCAT19(bVar32,CONCAT18(cVar31,CONCAT17(cVar30,CONCAT16(cVar29,
                                                  CONCAT15(cVar28,CONCAT14(cVar27,CONCAT13(cVar26,
                                                  CONCAT12(cVar25,CONCAT11(cVar24,cVar23))))))))) >>
                                  7) & 1) << 6 |
                   (ushort)((byte)(CONCAT18(bVar32,CONCAT17(cVar31,CONCAT16(cVar30,CONCAT15(cVar29,
                                                  CONCAT14(cVar28,CONCAT13(cVar27,CONCAT12(cVar26,
                                                  CONCAT11(cVar25,cVar24)))))))) >> 7) & 1) << 7 |
                  (ushort)(bVar32 >> 7) << 0xf) != 0xffff) goto LAB_00135f13;
    }
    if (local_48->UserCallback == (ImDrawCallback)0x0) {
      if ((this->CmdBuffer).Size < 2) {
        local_50 = (ImDrawCmd *)0x0;
      }
      else {
        local_50 = local_48 + -1;
      }
      if ((local_48->ElemCount == 0) && (local_50 != (ImDrawCmd *)0x0)) {
        cVar17 = -(*(char *)&(local_50->ClipRect).x == (char)curr_cmd);
        cVar18 = -(*(char *)((long)&(local_50->ClipRect).x + 1) == curr_cmd._1_1_);
        cVar19 = -(*(char *)((long)&(local_50->ClipRect).x + 2) == curr_cmd._2_1_);
        cVar20 = -(*(char *)((long)&(local_50->ClipRect).x + 3) == curr_cmd._3_1_);
        cVar21 = -(*(char *)&(local_50->ClipRect).y == curr_cmd._4_1_);
        cVar22 = -(*(char *)((long)&(local_50->ClipRect).y + 1) == curr_cmd._5_1_);
        cVar23 = -(*(char *)((long)&(local_50->ClipRect).y + 2) == curr_cmd._6_1_);
        cVar24 = -(*(char *)((long)&(local_50->ClipRect).y + 3) == curr_cmd._7_1_);
        cVar25 = -(*(char *)&(local_50->ClipRect).z == curr_clip_rect.x._0_1_);
        cVar26 = -(*(char *)((long)&(local_50->ClipRect).z + 1) == curr_clip_rect.x._1_1_);
        cVar27 = -(*(char *)((long)&(local_50->ClipRect).z + 2) == curr_clip_rect.x._2_1_);
        cVar28 = -(*(char *)((long)&(local_50->ClipRect).z + 3) == curr_clip_rect.x._3_1_);
        cVar29 = -(*(char *)&(local_50->ClipRect).w == curr_clip_rect.y._0_1_);
        cVar30 = -(*(char *)((long)&(local_50->ClipRect).w + 1) == curr_clip_rect.y._1_1_);
        cVar31 = -(*(char *)((long)&(local_50->ClipRect).w + 2) == curr_clip_rect.y._2_1_);
        bVar32 = -(*(char *)((long)&(local_50->ClipRect).w + 3) == curr_clip_rect.y._3_1_);
        auVar7[1] = cVar18;
        auVar7[0] = cVar17;
        auVar7[2] = cVar19;
        auVar7[3] = cVar20;
        auVar7[4] = cVar21;
        auVar7[5] = cVar22;
        auVar7[6] = cVar23;
        auVar7[7] = cVar24;
        auVar7[8] = cVar25;
        auVar7[9] = cVar26;
        auVar7[10] = cVar27;
        auVar7[0xb] = cVar28;
        auVar7[0xc] = cVar29;
        auVar7[0xd] = cVar30;
        auVar7[0xe] = cVar31;
        auVar7[0xf] = bVar32;
        auVar8[1] = cVar18;
        auVar8[0] = cVar17;
        auVar8[2] = cVar19;
        auVar8[3] = cVar20;
        auVar8[4] = cVar21;
        auVar8[5] = cVar22;
        auVar8[6] = cVar23;
        auVar8[7] = cVar24;
        auVar8[8] = cVar25;
        auVar8[9] = cVar26;
        auVar8[10] = cVar27;
        auVar8[0xb] = cVar28;
        auVar8[0xc] = cVar29;
        auVar8[0xd] = cVar30;
        auVar8[0xe] = cVar31;
        auVar8[0xf] = bVar32;
        auVar16[1] = cVar20;
        auVar16[0] = cVar19;
        auVar16[2] = cVar21;
        auVar16[3] = cVar22;
        auVar16[4] = cVar23;
        auVar16[5] = cVar24;
        auVar16[6] = cVar25;
        auVar16[7] = cVar26;
        auVar16[8] = cVar27;
        auVar16[9] = cVar28;
        auVar16[10] = cVar29;
        auVar16[0xb] = cVar30;
        auVar16[0xc] = cVar31;
        auVar16[0xd] = bVar32;
        auVar14[1] = cVar21;
        auVar14[0] = cVar20;
        auVar14[2] = cVar22;
        auVar14[3] = cVar23;
        auVar14[4] = cVar24;
        auVar14[5] = cVar25;
        auVar14[6] = cVar26;
        auVar14[7] = cVar27;
        auVar14[8] = cVar28;
        auVar14[9] = cVar29;
        auVar14[10] = cVar30;
        auVar14[0xb] = cVar31;
        auVar14[0xc] = bVar32;
        auVar12[1] = cVar22;
        auVar12[0] = cVar21;
        auVar12[2] = cVar23;
        auVar12[3] = cVar24;
        auVar12[4] = cVar25;
        auVar12[5] = cVar26;
        auVar12[6] = cVar27;
        auVar12[7] = cVar28;
        auVar12[8] = cVar29;
        auVar12[9] = cVar30;
        auVar12[10] = cVar31;
        auVar12[0xb] = bVar32;
        auVar10[1] = cVar23;
        auVar10[0] = cVar22;
        auVar10[2] = cVar24;
        auVar10[3] = cVar25;
        auVar10[4] = cVar26;
        auVar10[5] = cVar27;
        auVar10[6] = cVar28;
        auVar10[7] = cVar29;
        auVar10[8] = cVar30;
        auVar10[9] = cVar31;
        auVar10[10] = bVar32;
        if ((ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB141(auVar16 >> 7,0) & 1) << 2 |
                     (ushort)(SUB131(auVar14 >> 7,0) & 1) << 3 |
                     (ushort)(SUB121(auVar12 >> 7,0) & 1) << 4 |
                     (ushort)(SUB111(auVar10 >> 7,0) & 1) << 5 |
                     (ushort)((byte)(CONCAT19(bVar32,CONCAT18(cVar31,CONCAT17(cVar30,CONCAT16(cVar29
                                                  ,CONCAT15(cVar28,CONCAT14(cVar27,CONCAT13(cVar26,
                                                  CONCAT12(cVar25,CONCAT11(cVar24,cVar23))))))))) >>
                                    7) & 1) << 6 |
                     (ushort)((byte)(CONCAT18(bVar32,CONCAT17(cVar31,CONCAT16(cVar30,CONCAT15(cVar29
                                                  ,CONCAT14(cVar28,CONCAT13(cVar27,CONCAT12(cVar26,
                                                  CONCAT11(cVar25,cVar24)))))))) >> 7) & 1) << 7 |
                    (ushort)(bVar32 >> 7) << 0xf) == 0xffff) {
          if ((this->_TextureIdStack).Size == 0) {
            local_60 = (ImTextureID)0x0;
          }
          else {
            local_60 = (this->_TextureIdStack).Data[(this->_TextureIdStack).Size + -1];
          }
          if ((local_50->TextureId == local_60) && (local_50->UserCallback == (ImDrawCallback)0x0))
          {
            ImVector<ImDrawCmd>::pop_back(&this->CmdBuffer);
            return;
          }
        }
      }
      (local_48->ClipRect).x = (float)uVar1;
      (local_48->ClipRect).y = (float)uVar3;
      (local_48->ClipRect).z = (float)uVar2;
      (local_48->ClipRect).w = (float)uVar4;
      return;
    }
  }
LAB_00135f13:
  AddDrawCmd(this);
  return;
}

Assistant:

void ImDrawList::UpdateClipRect()
{
    // If current command is used with different settings we need to add a new command
    const ImVec4 curr_clip_rect = GetCurrentClipRect();
    ImDrawCmd* curr_cmd = CmdBuffer.Size > 0 ? &CmdBuffer.Data[CmdBuffer.Size-1] : NULL;
    if (!curr_cmd || (curr_cmd->ElemCount != 0 && memcmp(&curr_cmd->ClipRect, &curr_clip_rect, sizeof(ImVec4)) != 0) || curr_cmd->UserCallback != NULL)
    {
        AddDrawCmd();
        return;
    }

    // Try to merge with previous command if it matches, else use current command
    ImDrawCmd* prev_cmd = CmdBuffer.Size > 1 ? curr_cmd - 1 : NULL;
    if (curr_cmd->ElemCount == 0 && prev_cmd && memcmp(&prev_cmd->ClipRect, &curr_clip_rect, sizeof(ImVec4)) == 0 && prev_cmd->TextureId == GetCurrentTextureId() && prev_cmd->UserCallback == NULL)
        CmdBuffer.pop_back();
    else
        curr_cmd->ClipRect = curr_clip_rect;
}